

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimhelpers.cpp
# Opt level: O2

string * btorsim_bv_to_hex_string_abi_cxx11_(string *__return_storage_ptr__,BtorSimBitVector *bv)

{
  char *__ptr;
  allocator local_11;
  
  __ptr = btorsim_bv_to_hex_char(bv);
  std::__cxx11::string::string((string *)__return_storage_ptr__,__ptr,&local_11);
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

std::string
btorsim_bv_to_hex_string (const BtorSimBitVector *bv)
{
  char *bv_char = btorsim_bv_to_hex_char (bv);
  std::string res (bv_char);
  BTOR2_DELETE (bv_char);
  return res;
}